

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadString(ON_BinaryArchive *this,ON_wString *s)

{
  uint sUTF16_count_00;
  ON__UINT16 *sUTF16_00;
  size_t count;
  int sUTF32_count;
  int iVar1;
  unsigned_short *puVar2;
  wchar_t *sUTF32;
  int utf32_array_count1;
  int utf32_array_count;
  uint error_status;
  uint error_mask;
  ON__UINT32 error_code_point;
  int sUTF16_count;
  int bTestByteOrder;
  ON__UINT16 *sUTF16;
  undefined1 local_40 [8];
  ON_SimpleArray<unsigned_short> utf16_buffer;
  int istring_utf16_element_count;
  bool rc;
  size_t string_utf16_element_count;
  ON_wString *s_local;
  ON_BinaryArchive *this_local;
  
  string_utf16_element_count = (size_t)s;
  s_local = (ON_wString *)this;
  ON_wString::Destroy(s);
  _istring_utf16_element_count = 0;
  utf16_buffer.m_capacity._3_1_ =
       ReadStringUTF16ElementCount(this,(size_t *)&istring_utf16_element_count);
  if (((bool)utf16_buffer.m_capacity._3_1_) && (_istring_utf16_element_count != 0)) {
    utf16_buffer.m_count = istring_utf16_element_count;
    ON_SimpleArray<unsigned_short>::ON_SimpleArray
              ((ON_SimpleArray<unsigned_short> *)local_40,(long)istring_utf16_element_count);
    count = _istring_utf16_element_count;
    puVar2 = ON_SimpleArray<unsigned_short>::Array((ON_SimpleArray<unsigned_short> *)local_40);
    utf16_buffer.m_capacity._3_1_ = ReadInt16(this,count,(ON__INT16 *)puVar2);
    if ((bool)utf16_buffer.m_capacity._3_1_) {
      ON_SimpleArray<unsigned_short>::SetCount
                ((ON_SimpleArray<unsigned_short> *)local_40,utf16_buffer.m_count);
      puVar2 = ON_SimpleArray<unsigned_short>::operator[]
                         ((ON_SimpleArray<unsigned_short> *)local_40,utf16_buffer.m_count + -1);
      *puVar2 = 0;
      utf16_buffer.m_capacity._3_1_ = 0;
      _sUTF16_count =
           ON_SimpleArray<unsigned_short>::Array((ON_SimpleArray<unsigned_short> *)local_40);
      error_code_point = 0;
      error_mask = utf16_buffer.m_count - 1;
      error_status = 0xfffd;
      utf32_array_count = -1;
      utf32_array_count1 = 0;
      sUTF32_count = ON_ConvertUTF16ToUTF32
                               (0,_sUTF16_count,error_mask,(uint *)0x0,0,(uint *)&utf32_array_count1
                                ,0xffffffff,0xfffd,(ON__UINT16 **)0x0);
      if (sUTF32_count == 0) {
        utf16_buffer.m_capacity._3_1_ = 1;
      }
      else if (0 < sUTF32_count) {
        utf32_array_count1 = 0;
        ON_wString::ReserveArray((ON_wString *)string_utf16_element_count,(long)(sUTF32_count + 1));
        sUTF16_00 = _sUTF16_count;
        sUTF16_count_00 = error_mask;
        sUTF32 = ON_wString::Array((ON_wString *)string_utf16_element_count);
        iVar1 = ON_ConvertUTF16ToUTF32
                          (0,sUTF16_00,sUTF16_count_00,(uint *)sUTF32,sUTF32_count,
                           (uint *)&utf32_array_count1,0xffffffff,0xfffd,(ON__UINT16 **)0x0);
        if (iVar1 == sUTF32_count) {
          ON_wString::SetLength((ON_wString *)string_utf16_element_count,(long)sUTF32_count);
          utf16_buffer.m_capacity._3_1_ = 1;
        }
      }
    }
    ON_SimpleArray<unsigned_short>::~ON_SimpleArray((ON_SimpleArray<unsigned_short> *)local_40);
    if ((utf16_buffer.m_capacity._3_1_ & 1) == 0) {
      ON_wString::Destroy((ON_wString *)string_utf16_element_count);
    }
  }
  return (bool)(utf16_buffer.m_capacity._3_1_ & 1);
}

Assistant:

bool
ON_BinaryArchive::ReadString( ON_wString& s )
{
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// about 2 == sizeof(wchar_t).  Since this code has to run on machines
// where sizeof(wchar_t) can be 2, 4, or 8 bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  s.Destroy();
  size_t string_utf16_element_count = 0;
  bool rc = ReadStringUTF16ElementCount( &string_utf16_element_count );
  if ( rc && string_utf16_element_count > 0 ) 
  {
    // string_utf16_element_count = number of ON__INT16 elements in
    // the string.  This is almost always the same as the
    // number of unicode code points. However, if one of
    // the code points happens to require two ON__INT16 
    // values to encode, then string_utf16_element_count will be 
    // larger than the number of unicode code points in 
    // the array.
    const int istring_utf16_element_count = (int)string_utf16_element_count;
    if ( 2 == sizeof(wchar_t) ) 
    {
      // When sizeof(wchar_t) is 2 bytes, assume wchar_t strings are 
      // UTF-16 encoded unicode strings.
      s.ReserveArray( istring_utf16_element_count );
      rc = ReadInt16( string_utf16_element_count, (ON__INT16*)s.Array() );
      if (rc)
        s.SetLength( istring_utf16_element_count-1 );
    }
    else if ( 4 == sizeof(wchar_t)  )
    {
      // When sizeof(wchar_t) is 4 bytes, assume wchar_t strings are 
      // UTF-32 encoded unicode strings. (some Apple CLang and GNU gcc implementations do this.)

      // Read the UTF-16 encode string from the file into
      // utf16_buffer[].
      ON_SimpleArray<ON__UINT16> utf16_buffer(istring_utf16_element_count);
      rc = ReadInt16(string_utf16_element_count,(ON__INT16*)utf16_buffer.Array());
      if(rc)
      {
        // convert to a UTF-32 encoded unicode string.
        utf16_buffer.SetCount(istring_utf16_element_count);
        utf16_buffer[istring_utf16_element_count-1] = 0;
        rc = false;
        const ON__UINT16* sUTF16 = utf16_buffer.Array();
        const int bTestByteOrder = false;
        const int sUTF16_count = istring_utf16_element_count-1;
        const ON__UINT32 error_code_point = 0xFFFD;
        const unsigned int error_mask = 0xFFFFFFFF;
        unsigned int error_status = 0;

        const int utf32_array_count = ON_ConvertUTF16ToUTF32(
            bTestByteOrder,
            sUTF16,
            sUTF16_count,
            0, // unsigned int* sUTF32
            0, // int sUTF32_count
            &error_status,
            error_mask,
            error_code_point,
            0 // const ON__UINT16** sNextUTF16
            );

        if ( 0 == utf32_array_count )
        {
          rc = true;
        }
        else if ( utf32_array_count > 0 )
        {
          error_status = 0;
          s.ReserveArray(utf32_array_count+1);
          const int utf32_array_count1 = ON_ConvertUTF16ToUTF32(
              bTestByteOrder,
              sUTF16,
              sUTF16_count,
              (unsigned int*)s.Array(), // unsigned int* sUTF32
              utf32_array_count, // sUTF32_count
              &error_status,
              error_mask,
              error_code_point,
              0 // const ON__UINT16** sNextUTF16
              );
          if ( utf32_array_count1 == utf32_array_count )
          {
            s.SetLength( utf32_array_count );
            rc = true;
          }
        }
      }
    }
    if (!rc)
      s.Destroy();
  }
  return rc;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif
}